

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O1

void __thiscall tcmalloc::ThreadCache::Free(ThreadCache *this,void *ptr,uint64_t cl)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t uVar5;
  int iVar6;
  long lVar7;
  
  if (0x54 < cl - 1) {
    __assert_fail("0 < cl && cl < kMaxClass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/thread_cache.hpp"
                  ,0x32,"void tcmalloc::ThreadCache::Free(void *, uint64_t)");
  }
  uVar3 = (long)(int)this->freelists_[cl].obj_bytes_ + this->size_;
  this->size_ = uVar3;
  this->total_free_ = this->total_free_ + (&SizeClasses)[cl * 3];
  *(void **)ptr = this->freelists_[cl].list_.head_;
  this->freelists_[cl].list_.head_ = ptr;
  uVar5 = this->freelists_[cl].list_.free_count_ + 1;
  this->freelists_[cl].list_.free_count_ = uVar5;
  if ((ulong)this->freelists_[cl].max_length_ < (ulong)(long)(int)uVar5) {
    ListTooLong(this,this->freelists_ + cl);
    return;
  }
  if (uVar3 <= this->max_size_) {
    return;
  }
  lVar7 = 0;
  do {
    uVar4 = *(uint *)((long)&this->freelists_[0].lowater_ + lVar7);
    if (0 < (int)uVar4) {
      uVar1 = *(undefined8 *)
               (&DAT_00108130 + (long)*(int *)((long)&this->freelists_[0].cl_ + lVar7) * 0x18);
      uVar4 = uVar4 >> 1;
      if (uVar4 < 2) {
        uVar4 = 1;
      }
      ReleaseToCentralCache
                (this,(ThreadCacheFreeList *)((long)&this->freelists_[0].list_.free_count_ + lVar7),
                 uVar4);
      uVar4 = *(uint *)((long)&this->freelists_[0].max_length_ + lVar7);
      iVar6 = (int)uVar1;
      if ((ulong)(long)iVar6 < (ulong)uVar4) {
        iVar2 = uVar4 - iVar6;
        if (iVar2 < iVar6) {
          iVar2 = iVar6;
        }
        *(int *)((long)&this->freelists_[0].max_length_ + lVar7) = iVar2;
      }
    }
    *(undefined4 *)((long)&this->freelists_[0].lowater_ + lVar7) =
         *(undefined4 *)((long)&this->freelists_[0].list_.free_count_ + lVar7);
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0x1020);
  IncreaseCacheLimit(this);
  return;
}

Assistant:

void Free(void* ptr, uint64_t cl) {
        assert(0 < cl && cl < kMaxClass);
        size_ += freelists_[cl].object_bytes();
        total_free_ += ClassSize(cl);
        int length = freelists_[cl].Push(ptr);
        if (length > freelists_[cl].max_length()) {
            ListTooLong(freelists_[cl]);
            return;
        }
        if (size_ > max_size_){
            Scavenge();
        }
    }